

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intgemm.cc
# Opt level: O3

void intgemm::UnsupportedCPUError(void)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = &PTR__exception_0010dd70;
  __cxa_throw(puVar1,&UnsupportedCPU::typeinfo,std::exception::~exception);
}

Assistant:

void UnsupportedCPUError() {
#if (defined(_MSC_VER) && !defined(__clang__)) ? (_HAS_EXCEPTIONS) : (__EXCEPTIONS)
  throw UnsupportedCPU();
#else
  fprintf(stderr, "intgemm does not support this CPU.\n");
  abort();
#endif
}